

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O3

int nsync_cv_wait_with_deadline_generic
              (nsync_cv *pcv,void *pmu,_func_void_void_ptr *lock,_func_void_void_ptr *unlock,
              nsync_time abs_deadline,nsync_note cancel_note)

{
  nsync_atomic_uint32_ nVar1;
  nsync_atomic_uint32_ nVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  waiter *w;
  nsync_dll_list_ pnVar7;
  nsync_mu *mu;
  uint uVar8;
  nsync_dll_element_ *e;
  bool bVar9;
  int local_64;
  
  w = nsync_waiter_new_();
  mu = (nsync_mu *)0x0;
  if (lock == nsync_mu_lock) {
    mu = (nsync_mu *)pmu;
  }
  if (lock == void_mu_lock) {
    mu = (nsync_mu *)pmu;
  }
  (w->nw).waiting = 1;
  if (lock == nsync_mu_rlock) {
    mu = (nsync_mu *)pmu;
  }
  (w->cond).f = (_func_int_void_ptr *)0x0;
  (w->cond).v = (void *)0x0;
  (w->cond).eq = (_func_int_void_ptr_void_ptr *)0x0;
  w->cv_mu = mu;
  if (mu == (nsync_mu *)0x0) {
    w->l_type = (lock_type *)0x0;
  }
  else {
    uVar8 = mu->word;
    if ((uVar8 & 1) == 0) {
      if (0xff < uVar8) {
        w->l_type = nsync_reader_type_;
        bVar3 = false;
        goto LAB_00104be7;
      }
      nsync_panic_("mu not held on entry to nsync_cv_wait_with_deadline()\n");
    }
    else {
      if (0xff < uVar8) {
        nsync_panic_(
                    "mu held in reader and writer mode simultaneously on entry to nsync_cv_wait_with_deadline()\n"
                    );
      }
      w->l_type = nsync_writer_type_;
    }
  }
  bVar3 = true;
LAB_00104be7:
  uVar4 = nsync_spin_test_and_set_(&pcv->word,1,3,0);
  e = &(w->nw).q;
  pnVar7 = nsync_dll_make_last_in_list_(pcv->waiters,e);
  pcv->waiters = pnVar7;
  nVar1 = w->remove_count;
  pcv->word = uVar4 | 2;
  if (bVar3) {
    (*unlock)(pmu);
  }
  else {
    nsync_mu_runlock(mu);
  }
  if ((w->nw).waiting == 0) {
    local_64 = 0;
  }
  else {
    iVar5 = 0;
    uVar8 = 0;
    local_64 = 0;
    do {
      if ((iVar5 == 0) &&
         (iVar5 = nsync_sem_wait_with_cancel_(w,abs_deadline,cancel_note), iVar5 == 0)) {
        iVar5 = 0;
      }
      else if ((w->nw).waiting != 0) {
        uVar4 = nsync_spin_test_and_set_(&pcv->word,1,1,0);
        if (((w->nw).waiting != 0) && (nVar1 == w->remove_count)) {
          pnVar7 = nsync_dll_remove_(pcv->waiters,e);
          pcv->waiters = pnVar7;
          do {
            nVar2 = w->remove_count;
            LOCK();
            bVar9 = nVar2 == w->remove_count;
            if (bVar9) {
              w->remove_count = nVar2 + 1;
            }
            UNLOCK();
          } while (!bVar9);
          iVar6 = nsync_dll_is_empty_(pcv->waiters);
          if (iVar6 != 0) {
            uVar4 = uVar4 & 0xfffffffd;
          }
          (w->nw).waiting = 0;
          local_64 = iVar5;
        }
        pcv->word = uVar4;
      }
      if ((w->nw).waiting != 0) {
        uVar8 = nsync_spin_delay_(uVar8);
      }
    } while ((w->nw).waiting != 0);
  }
  if ((mu == (nsync_mu *)0x0) || (w->cv_mu != (nsync_mu_s_ *)0x0)) {
    nsync_waiter_free_(w);
    if (bVar3) {
      (*lock)(pmu);
    }
    else {
      nsync_mu_rlock(mu);
    }
  }
  else {
    nsync_mu_lock_slow_(mu,w,8,w->l_type);
    nsync_waiter_free_(w);
  }
  return local_64;
}

Assistant:

int nsync_cv_wait_with_deadline_generic (nsync_cv *pcv, void *pmu,
					 void (*lock) (void *), void (*unlock) (void *),
					 nsync_time abs_deadline,
					 nsync_note cancel_note) {
	nsync_mu *cv_mu = NULL;
	int is_reader_mu;
	uint32_t old_word;
	uint32_t remove_count;
	int sem_outcome;
	unsigned attempts;
	int outcome = 0;
	waiter *w;
	IGNORE_RACES_START ();
	w = nsync_waiter_new_ ();
	ATM_STORE (&w->nw.waiting, 1);
	w->cond.f = NULL; /* Not using a conditional critical section. */
	w->cond.v = NULL;
	w->cond.eq = NULL;
	if (lock == &void_mu_lock ||
	    lock == (void (*) (void *)) &nsync_mu_lock ||
	    lock == (void (*) (void *)) &nsync_mu_rlock) {
		cv_mu = (nsync_mu *) pmu;
	}
	w->cv_mu = cv_mu;       /* If *pmu is an nsync_mu, record its address, else record NULL. */
	is_reader_mu = 0; /* If true, an nsync_mu in reader mode. */
	if (cv_mu == NULL) {
		w->l_type = NULL;
	} else {
		uint32_t old_mu_word = ATM_LOAD (&cv_mu->word);
		int is_writer = (old_mu_word & MU_WHELD_IF_NON_ZERO) != 0;
		int is_reader = (old_mu_word & MU_RHELD_IF_NON_ZERO) != 0;
		if (is_writer) {
			if (is_reader) {
				nsync_panic_ ("mu held in reader and writer mode simultaneously "
				       "on entry to nsync_cv_wait_with_deadline()\n");
			}
			w->l_type = nsync_writer_type_;
		} else if (is_reader) {
			w->l_type = nsync_reader_type_;
			is_reader_mu = 1;
		} else {
			nsync_panic_ ("mu not held on entry to nsync_cv_wait_with_deadline()\n");
		}
	}

	/* acquire spinlock, set non-empty */
	old_word = nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK, CV_SPINLOCK|CV_NON_EMPTY, 0);
	pcv->waiters = nsync_dll_make_last_in_list_ (pcv->waiters, &w->nw.q);
	remove_count = ATM_LOAD (&w->remove_count);
	/* Release the spin lock. */
	ATM_STORE_REL (&pcv->word, old_word|CV_NON_EMPTY); /* release store */

	/* Release *pmu. */
	if (is_reader_mu) {
		nsync_mu_runlock (cv_mu);
	} else {
		(*unlock) (pmu);
	}

	/* wait until awoken or a timeout. */
	sem_outcome = 0;
	attempts = 0;
	while (ATM_LOAD_ACQ (&w->nw.waiting) != 0) { /* acquire load */
		if (sem_outcome == 0) {
			sem_outcome = nsync_sem_wait_with_cancel_ (w, abs_deadline, cancel_note);
		}

		if (sem_outcome != 0 && ATM_LOAD (&w->nw.waiting) != 0) {
			/* A timeout or cancellation occurred, and no wakeup.
			   Acquire *pcv's spinlock, and confirm.  */
			old_word = nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK,
							     CV_SPINLOCK, 0);
			/* Check that w wasn't removed from the queue after we
			   checked above, but before we acquired the spinlock.
			   The test of remove_count confirms that the waiter *w
			   is still governed by *pcv's spinlock; otherwise, some
			   other thread is about to set w.waiting==0.  */
			if (ATM_LOAD (&w->nw.waiting) != 0) {
				if (remove_count == ATM_LOAD (&w->remove_count)) {
					uint32_t old_value;
					/* still in cv waiter queue */
					/* Not woken, so remove *w from cv
					   queue, and declare a
					   timeout/cancellation.  */
					outcome = sem_outcome;
					pcv->waiters = nsync_dll_remove_ (pcv->waiters,
								          &w->nw.q);
					do {    
						old_value = ATM_LOAD (&w->remove_count);
					} while (!ATM_CAS (&w->remove_count, old_value, old_value+1));
					if (nsync_dll_is_empty_ (pcv->waiters)) {
						old_word &= ~(CV_NON_EMPTY);
					}
					ATM_STORE_REL (&w->nw.waiting, 0); /* release store */
				}
			}
			/* Release spinlock. */
			ATM_STORE_REL (&pcv->word, old_word); /* release store */
		}

		if (ATM_LOAD (&w->nw.waiting) != 0) {
                        /* The delay here causes this thread ultimately to
                           yield to another that has dequeued this thread, but
                           has not yet set the waiting field to zero; a
                           cancellation or timeout may prevent this thread
                           from blocking above on the semaphore.  */
			attempts = nsync_spin_delay_ (attempts);
		}
	}

	if (cv_mu != NULL && w->cv_mu == NULL) { /* waiter was moved to *pmu's queue, and woken. */
		/* Requeue on *pmu using existing waiter struct; current thread
		   is the designated waker.  */
		nsync_mu_lock_slow_ (cv_mu, w, MU_DESIG_WAKER, w->l_type);
		RWLOCK_TRYACQUIRE (1, cv_mu, w->l_type == nsync_writer_type_);
		nsync_waiter_free_ (w);
	} else {
		/* Traditional case: We've woken from the cv, and need to reacquire *pmu. */
		nsync_waiter_free_ (w);
		if (is_reader_mu) {
			nsync_mu_rlock (cv_mu);
		} else {
			(*lock) (pmu);
		}
	}
	IGNORE_RACES_END ();
	return (outcome);
}